

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::
       MpRepeatedVarintT<false,unsigned_long,(unsigned_short)512>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  TcParseTableBase *ctx_00;
  ParseContext *pPVar1;
  int8_t iVar2;
  byte bVar3;
  bool bVar4;
  uint32_t uVar5;
  uint uVar6;
  uint *puVar7;
  char *pcVar8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_280 [2];
  TcFieldData local_270;
  unsigned_long local_268;
  uint64_t tmp;
  FieldAux aux;
  RepeatedField<unsigned_long> *field;
  void *base;
  ParseContext *pPStack_240;
  uint32_t next_tag;
  char *ptr2;
  bool is_validated_enum;
  bool is_zigzag;
  uint16_t xform_val;
  uint32_t decoded_tag;
  FieldEntry *entry;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  uint64_t local_1f0;
  int64_t res;
  uint32_t has_bits_offset;
  ulong local_188;
  int64_t res3;
  int64_t res2;
  anon_class_8_1_54a39810 last;
  anon_class_8_1_54a39810 next;
  bool kIs32BitVarint;
  bool kIs64BitVarint;
  ParseContext *local_158;
  ParseContext *local_150;
  int64_t *local_148;
  int8_t local_131;
  ulong *local_130;
  int8_t local_119;
  int64_t *local_118;
  int8_t local_101;
  ulong *local_100;
  int8_t local_e9;
  int8_t local_d9;
  int8_t local_c9;
  int8_t local_b9;
  int8_t local_a9;
  int64_t *local_a8;
  int8_t local_91;
  ulong *local_90;
  int8_t local_79;
  int64_t *local_78;
  int8_t local_61;
  ulong *local_60;
  int8_t local_49;
  int8_t local_39;
  int8_t local_29;
  int8_t local_19;
  int8_t local_9;
  
  entry = (FieldEntry *)hasbits;
  hasbits_local = (uint64_t)table;
  table_local = (TcParseTableBase *)ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)msg;
  msg_local = (MessageLite *)data.field_0;
  uVar5 = TcFieldData::entry_offset((TcFieldData *)&msg_local);
  _is_validated_enum =
       RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,(ulong)uVar5);
  ptr2._4_4_ = TcFieldData::tag((TcFieldData *)&msg_local);
  ptr2._2_2_ = 0x200;
  ptr2._1_1_ = 1;
  ptr2._0_1_ = 0;
  pPStack_240 = ctx_local;
  field = (RepeatedField<unsigned_long> *)
          MaybeGetSplitBase((MessageLite *)ptr_local,false,(TcParseTableBase *)hasbits_local);
  aux.table = (TcParseTableBase *)
              MaybeCreateRepeatedFieldRefAt<unsigned_long,false>
                        (field,(ulong)_is_validated_enum->offset,(MessageLite *)ptr_local);
  TcParseTableBase::FieldAux::FieldAux((FieldAux *)&tmp);
  do {
    local_158 = pPStack_240;
    last.p = (char **)&local_158;
    res2 = (int64_t)&local_158;
    iVar2 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()(&last);
    local_1f0 = (uint64_t)iVar2;
    if (iVar2 < '\0') {
      local_131 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()(&last)
      ;
      local_148 = &res3;
      res3 = (long)local_131 << 7 | local_1f0 >> 0x39;
      local_d9 = local_131;
      if (res3 < 0) {
        local_119 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                              (&last);
        local_130 = &local_188;
        local_188 = (long)local_119 << 0xe | local_1f0 >> 0x32;
        local_c9 = local_119;
        if ((long)local_188 < 0) {
          local_101 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                                (&last);
          local_118 = &res3;
          res3 = ((long)local_101 << 0x15 | local_1f0 >> 0x2b) & res3;
          local_b9 = local_101;
          if (res3 < 0) {
            local_e9 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                                 (&last);
            local_100 = &local_188;
            local_188 = ((long)local_e9 << 0x1c | local_1f0 >> 0x24) & local_188;
            local_a9 = local_e9;
            if ((long)local_188 < 0) {
              local_91 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                                   (&last);
              local_a8 = &res3;
              res3 = ((long)local_91 << 0x23 | local_1f0 >> 0x1d) & res3;
              local_39 = local_91;
              if (res3 < 0) {
                local_79 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                           operator()(&last);
                local_90 = &local_188;
                local_188 = ((long)local_79 << 0x2a | local_1f0 >> 0x16) & local_188;
                local_29 = local_79;
                if ((long)local_188 < 0) {
                  local_61 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                             operator()(&last);
                  local_78 = &res3;
                  res3 = ((long)local_61 << 0x31 | local_1f0 >> 0xf) & res3;
                  local_19 = local_61;
                  if (res3 < 0) {
                    local_49 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                               operator()(&last);
                    local_60 = &local_188;
                    local_188 = ((long)local_49 << 0x38 | local_1f0 >> 8) & local_188;
                    local_9 = local_49;
                    if (((long)local_188 < 0) &&
                       (iVar2 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                                operator()(&last), iVar2 != '\x01')) {
                      iVar2 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                              operator()((anon_class_8_1_54a39810 *)&res2);
                      if (((int)iVar2 & 0x80U) != 0) {
                        local_150 = (ParseContext *)0x0;
                        goto LAB_01ab1bf2;
                      }
                      bVar3 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                              operator()((anon_class_8_1_54a39810 *)&res2);
                      if ((bVar3 & 1) == 0) {
                        local_188 = local_188 ^ 0x8000000000000000;
                      }
                    }
                  }
                }
              }
            }
          }
        }
        res3 = local_188 & res3;
      }
      local_1f0 = res3 & local_1f0;
      if (local_158 == (ParseContext *)0x0) {
        protobuf_assumption_failed
                  ("p != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/varint_shuffle.h"
                   ,0x91);
      }
      local_150 = local_158;
    }
    else {
      local_150 = local_158;
    }
LAB_01ab1bf2:
    local_268 = local_1f0;
    ctx_local = local_150;
    if (local_150 == (ParseContext *)0x0) {
LAB_01ab1dba:
      pcVar8 = ptr_local;
      pPVar1 = ctx_local;
      ctx_00 = table_local;
      TcFieldData::TcFieldData((TcFieldData *)local_280);
      pcVar8 = Error((MessageLite *)pcVar8,(char *)pPVar1,(ParseContext *)ctx_00,
                     (TcFieldData)local_280[0],(TcParseTableBase *)hasbits_local,(uint64_t)entry);
      return pcVar8;
    }
    local_268 = WireFormatLite::ZigZagDecode64(local_1f0);
    RepeatedField<unsigned_long>::Add((RepeatedField<unsigned_long> *)aux.table,local_268);
    bVar4 = EpsCopyInputStream::DataAvailable((EpsCopyInputStream *)table_local,(char *)ctx_local);
    if (((bVar4 ^ 0xffU) & 1) != 0) break;
    pPStack_240 = (ParseContext *)ReadTag((char *)ctx_local,(uint32_t *)((long)&base + 4),0);
    if (pPStack_240 == (ParseContext *)0x0) goto LAB_01ab1dba;
  } while (base._4_4_ == ptr2._4_4_);
  pcVar8 = ptr_local;
  pPVar1 = ctx_local;
  TcFieldData::TcFieldData(&local_270);
  if (*(ushort *)hasbits_local != 0) {
    uVar6 = (uint)entry;
    puVar7 = RefAt<unsigned_int>(pcVar8,(ulong)(uint)*(ushort *)hasbits_local);
    *puVar7 = uVar6 | *puVar7;
  }
  return (char *)pPVar1;
}

Assistant:

const char* TcParser::MpRepeatedVarintT(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint32_t decoded_tag = data.tag();
  // For is_split we ignore the incoming xform_val and read it from entry to
  // reduce duplication for the uncommon paths.
  const uint16_t xform_val =
      is_split ? (entry.type_card & field_layout::kTvMask) : xform_val_in;
  const bool is_zigzag = xform_val == field_layout::kTvZigZag;
  const bool is_validated_enum = xform_val & field_layout::kTvEnum;

  const char* ptr2 = ptr;
  uint32_t next_tag;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  auto& field = MaybeCreateRepeatedFieldRefAt<FieldType, is_split>(
      base, entry.offset, msg);

  TcParseTableBase::FieldAux aux;
  if (is_validated_enum) {
    aux = *table->field_aux(&entry);
    PrefetchEnumData(xform_val, aux);
  }

  do {
    uint64_t tmp;
    ptr = ParseVarint(ptr2, &tmp);
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (is_validated_enum) {
      if (!EnumIsValidAux(static_cast<int32_t>(tmp), xform_val, aux)) {
        ptr = ptr2;
        PROTOBUF_MUSTTAIL return MpUnknownEnumFallback(PROTOBUF_TC_PARAM_PASS);
      }
    } else if (is_zigzag) {
      tmp = sizeof(FieldType) == 8 ? WireFormatLite::ZigZagDecode64(tmp)
                                   : WireFormatLite::ZigZagDecode32(tmp);
    }
    field.Add(static_cast<FieldType>(tmp));
    if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);

parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}